

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O3

UStringTrieResult __thiscall icu_63::UCharsTrie::next(UCharsTrie *this,int32_t uchar)

{
  char16_t cVar1;
  UChar UVar2;
  int iVar3;
  char16_t *pcVar4;
  uint length;
  UStringTrieResult UVar5;
  uint uVar6;
  UChar *pos;
  
  pcVar4 = this->pos_;
  UVar5 = USTRINGTRIE_NO_MATCH;
  if (pcVar4 != (char16_t *)0x0) {
    iVar3 = this->remainingMatchLength_;
    if (iVar3 < 0) {
      cVar1 = *pcVar4;
      pos = pcVar4 + 1;
      length = (uint)(ushort)cVar1;
      if (0x2f < (ushort)cVar1) {
        length = (ushort)cVar1 & 0x3f;
        uVar6 = (uint)(ushort)cVar1;
        do {
          if (uVar6 < 0x40) {
            if ((uint)(ushort)*pos == uchar) {
              this->remainingMatchLength_ = uVar6 - 0x31;
              this->pos_ = pos + 1;
              if (uVar6 != 0x30) {
                return USTRINGTRIE_NO_VALUE;
              }
              UVar2 = pos[1];
              if ((ushort)UVar2 < 0x40) {
                return USTRINGTRIE_NO_VALUE;
              }
              return (ushort)UVar2 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
            }
LAB_002ac23a:
            this->pos_ = (char16_t *)0x0;
            return USTRINGTRIE_NO_MATCH;
          }
          if (0x7fff < uVar6) goto LAB_002ac23a;
          if (0x403f < uVar6) {
            if (uVar6 < 0x7fc0) {
              pos = pos + 1;
            }
            else {
              pos = pos + 2;
            }
          }
          uVar6 = length;
        } while (0x2f < length);
      }
      UVar5 = branchNext(this,pos,length,uchar);
      return UVar5;
    }
    if ((uint)(ushort)*pcVar4 == uchar) {
      UVar5 = USTRINGTRIE_NO_VALUE;
      this->remainingMatchLength_ = iVar3 + -1;
      this->pos_ = pcVar4 + 1;
      if ((iVar3 == 0) && (cVar1 = pcVar4[1], 0x3f < (ushort)cVar1)) {
        return (ushort)cVar1 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
    }
    else {
      this->pos_ = (char16_t *)0x0;
    }
  }
  return UVar5;
}

Assistant:

UStringTrieResult
UCharsTrie::next(int32_t uchar) {
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Remaining part of a linear-match node.
        if(uchar==*pos++) {
            remainingMatchLength_=--length;
            pos_=pos;
            int32_t node;
            return (length<0 && (node=*pos)>=kMinValueLead) ?
                    valueResult(node) : USTRINGTRIE_NO_VALUE;
        } else {
            stop();
            return USTRINGTRIE_NO_MATCH;
        }
    }
    return nextImpl(pos, uchar);
}